

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O2

void __thiscall OpenMD::DLM::doRotate(DLM *this,StuntDouble *sd,Vector3d *ji,RealType dt)

{
  ulong uVar1;
  int axes1;
  Mat3x3d *this_00;
  int axes2;
  ulong uVar2;
  ulong uVar3;
  RealType angle;
  double dVar4;
  Mat3x3d I;
  RotMat3x3d A;
  
  dVar4 = dt * 0.5;
  StuntDouble::getA(&A,sd);
  this_00 = &I;
  (*sd->_vptr_StuntDouble[5])(this_00,sd);
  if (sd->linear_ == true) {
    axes2 = sd->linearAxis_;
    uVar1 = (long)(axes2 + 1) % 3;
    uVar2 = uVar1 & 0xffffffff;
    uVar3 = (long)(axes2 + 2) % 3;
    axes1 = (int)uVar3;
    uVar3 = uVar3 & 0xffffffff;
    rotateStep((DLM *)this_00,axes1,axes2,
               ((ji->super_Vector<double,_3U>).data_[uVar2] * dVar4) /
               *(double *)
                ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                uVar2 * 0x20),ji,&A);
    rotateStep((DLM *)this_00,axes2,(int)uVar1,
               (dt * (ji->super_Vector<double,_3U>).data_[uVar3]) /
               *(double *)
                ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                uVar3 * 0x20),ji,&A);
    angle = (dVar4 * (ji->super_Vector<double,_3U>).data_[uVar2]) /
            *(double *)
             ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
             uVar2 * 0x20);
  }
  else {
    axes1 = 1;
    axes2 = 2;
    rotateStep((DLM *)this_00,1,2,
               ((ji->super_Vector<double,_3U>).data_[0] * dVar4) /
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],ji,&A);
    rotateStep((DLM *)this_00,2,0,
               ((ji->super_Vector<double,_3U>).data_[1] * dVar4) /
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],ji,&A);
    rotateStep((DLM *)this_00,0,1,
               (dt * (ji->super_Vector<double,_3U>).data_[2]) /
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2],ji,&A);
    rotateStep((DLM *)this_00,2,0,
               ((ji->super_Vector<double,_3U>).data_[1] * dVar4) /
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],ji,&A);
    angle = (dVar4 * (ji->super_Vector<double,_3U>).data_[0]) /
            I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  rotateStep((DLM *)this_00,axes1,axes2,angle,ji,&A);
  (*sd->_vptr_StuntDouble[3])(sd,&A);
  return;
}

Assistant:

void DLM::doRotate(StuntDouble* sd, Vector3d& ji, RealType dt) {
    RealType dt2 = 0.5 * dt;
    RealType angle;

    RotMat3x3d A = sd->getA();
    Mat3x3d I    = sd->getI();

    // use the angular velocities to propagate the rotation matrix a full time
    // step
    if (sd->isLinear()) {
      int i = sd->linearAxis();
      int j = (i + 1) % 3;
      int k = (i + 2) % 3;

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

      angle = dt * ji[k] / I(k, k);
      rotateStep(i, j, angle, ji, A);

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

    } else {
      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the z-axis
      angle = dt * ji[2] / I(2, 2);
      rotateStep(0, 1, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);
    }

    sd->setA(A);
  }